

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_avx2.c
# Opt level: O2

void av1_highbd_dr_prediction_z1_avx2
               (uint16_t *dst,ptrdiff_t stride,int bw,int bh,uint16_t *above,uint16_t *left,
               int upsample_above,int dx,int dy,int bd)

{
  int iVar1;
  int iVar2;
  uint16_t uVar3;
  ushort uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  ulong uVar8;
  long lVar9;
  byte bVar10;
  ulong uVar11;
  uint uVar12;
  uint uVar13;
  undefined1 (*pauVar14) [32];
  undefined1 (*pauVar15) [16];
  uint uVar16;
  uint uVar17;
  int iVar18;
  int iVar19;
  ulong uVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [32];
  undefined1 auVar27 [16];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [16];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [16];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar42 [16];
  undefined1 auVar41 [16];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar46 [16];
  undefined1 auVar47 [32];
  undefined1 auVar45 [16];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [32];
  undefined1 auVar67 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  ushort uVar76;
  undefined1 auVar77 [16];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  int in_stack_fffffffffffff780;
  undefined8 local_860 [262];
  undefined1 auVar23 [32];
  
  uVar8 = (ulong)(uint)bh;
  if (bw == 0x40) {
    if (bd < 0xc) {
      highbd_dr_prediction_z1_64xN_avx2(bh,dst,stride,above,dx,bd);
    }
    else {
      highbd_dr_prediction_32bit_z1_64xN_avx2(bh,dst,stride,above,dx,bd);
    }
  }
  else {
    bVar10 = (byte)upsample_above;
    if (bw == 8) {
      iVar19 = bh + 7 << (bVar10 & 0x1f);
      uVar3 = above[iVar19];
      auVar64._2_2_ = uVar3;
      auVar64._0_2_ = uVar3;
      auVar64._4_2_ = uVar3;
      auVar64._6_2_ = uVar3;
      auVar64._8_2_ = uVar3;
      auVar64._10_2_ = uVar3;
      auVar64._12_2_ = uVar3;
      auVar64._14_2_ = uVar3;
      auVar82._16_2_ = uVar3;
      auVar82._0_16_ = auVar64;
      auVar82._18_2_ = uVar3;
      auVar82._20_2_ = uVar3;
      auVar82._22_2_ = uVar3;
      auVar82._24_2_ = uVar3;
      auVar82._26_2_ = uVar3;
      auVar82._28_2_ = uVar3;
      auVar82._30_2_ = uVar3;
      uVar11 = 0;
      if (0 < bh) {
        uVar11 = (ulong)(uint)bh;
      }
      if (bd < 0xc) {
        auVar67._0_2_ = (undefined2)iVar19;
        auVar67._2_2_ = auVar67._0_2_;
        auVar67._4_2_ = auVar67._0_2_;
        auVar67._6_2_ = auVar67._0_2_;
        auVar67._8_2_ = auVar67._0_2_;
        auVar67._10_2_ = auVar67._0_2_;
        auVar67._12_2_ = auVar67._0_2_;
        auVar67._14_2_ = auVar67._0_2_;
        pauVar15 = (undefined1 (*) [16])local_860;
        auVar42._8_2_ = 0x10;
        auVar42._0_8_ = 0x10001000100010;
        auVar42._10_2_ = 0x10;
        auVar42._12_2_ = 0x10;
        auVar42._14_2_ = 0x10;
        auVar38._8_2_ = 0x1f;
        auVar38._0_8_ = 0x1f001f001f001f;
        auVar38._10_2_ = 0x1f;
        auVar38._12_2_ = 0x1f;
        auVar38._14_2_ = 0x1f;
        auVar38._16_2_ = 0x1f;
        auVar38._18_2_ = 0x1f;
        auVar38._20_2_ = 0x1f;
        auVar38._22_2_ = 0x1f;
        auVar38._24_2_ = 0x1f;
        auVar38._26_2_ = 0x1f;
        auVar38._28_2_ = 0x1f;
        auVar38._30_2_ = 0x1f;
        uVar16 = dx;
        for (uVar20 = 0; uVar11 != uVar20; uVar20 = uVar20 + 1) {
          uVar17 = (int)uVar16 >> (6 - bVar10 & 0x1f);
          if (iVar19 <= (int)uVar17) {
            if (bh <= (int)uVar20) {
              uVar8 = uVar20 & 0xffffffff;
            }
            for (; uVar20 != uVar8; uVar8 = uVar8 - 1) {
              *pauVar15 = auVar64;
              pauVar15 = pauVar15 + 1;
            }
            break;
          }
          auVar22 = *(undefined1 (*) [16])(above + (int)uVar17);
          if (upsample_above == 0) {
            auVar41 = *(undefined1 (*) [16])(above + (long)(int)uVar17 + 1);
            auVar46 = vpinsrw_avx(ZEXT416(uVar17),uVar17 + 1,1);
            auVar46 = vpinsrw_avx(auVar46,uVar17 + 2,2);
            auVar46 = vpinsrw_avx(auVar46,uVar17 + 3,3);
            auVar46 = vpinsrw_avx(auVar46,uVar17 + 4,4);
            auVar46 = vpinsrw_avx(auVar46,uVar17 + 5,5);
            auVar46 = vpinsrw_avx(auVar46,uVar17 + 6,6);
            auVar46 = vpinsrw_avx(auVar46,uVar17 + 7,7);
            uVar4 = (ushort)(uVar16 >> 1);
            uVar76 = uVar4 & 0x1f;
            auVar45._0_8_ = CONCAT26(uVar4,CONCAT24(uVar4,CONCAT22(uVar4,uVar4))) & 0x1f001f001f001f
            ;
            auVar45._8_2_ = uVar76;
            auVar45._10_2_ = uVar76;
            auVar45._12_2_ = uVar76;
            auVar45._14_2_ = uVar76;
          }
          else {
            auVar41 = vpblendw_avx(auVar22,(undefined1  [16])0x0,0xaa);
            auVar46 = vpblendw_avx(*(undefined1 (*) [16])(above + (long)(int)uVar17 + 8),
                                   (undefined1  [16])0x0,0xaa);
            auVar80 = vpsrld_avx(auVar22,0x10);
            auVar22 = vpackusdw_avx(auVar41,auVar46);
            auVar45 = vpsrld_avx(*(undefined1 (*) [16])(above + (long)(int)uVar17 + 8),0x10);
            auVar41 = vpinsrw_avx(ZEXT416(uVar17),uVar17 + 2,1);
            auVar41 = vpinsrw_avx(auVar41,uVar17 + 4,2);
            auVar41 = vpinsrw_avx(auVar41,uVar17 + 6,3);
            auVar41 = vpinsrw_avx(auVar41,uVar17 + 8,4);
            auVar41 = vpinsrw_avx(auVar41,uVar17 + 10,5);
            auVar41 = vpinsrw_avx(auVar41,uVar17 + 0xc,6);
            auVar46 = vpinsrw_avx(auVar41,uVar17 + 0xe,7);
            auVar68._0_2_ = (undefined2)uVar16;
            auVar68._2_2_ = auVar68._0_2_;
            auVar68._4_2_ = auVar68._0_2_;
            auVar68._6_2_ = auVar68._0_2_;
            auVar68._8_2_ = auVar68._0_2_;
            auVar68._10_2_ = auVar68._0_2_;
            auVar68._12_2_ = auVar68._0_2_;
            auVar68._14_2_ = auVar68._0_2_;
            auVar68._16_2_ = auVar68._0_2_;
            auVar68._18_2_ = auVar68._0_2_;
            auVar68._20_2_ = auVar68._0_2_;
            auVar68._22_2_ = auVar68._0_2_;
            auVar68._24_2_ = auVar68._0_2_;
            auVar68._26_2_ = auVar68._0_2_;
            auVar68._28_2_ = auVar68._0_2_;
            auVar68._30_2_ = auVar68._0_2_;
            auVar82 = vpsllw_avx2(auVar68,ZEXT416((uint)upsample_above));
            auVar41 = vpackusdw_avx(auVar80,auVar45);
            auVar82 = vpsrlw_avx2(auVar82,1);
            auVar82 = vpand_avx2(auVar82,auVar38);
            auVar45 = auVar82._0_16_;
          }
          auVar80 = vpsllw_avx(auVar22,5);
          auVar80 = vpaddw_avx(auVar80,auVar42);
          auVar22 = vpsubw_avx(auVar41,auVar22);
          auVar22 = vpmullw_avx(auVar45,auVar22);
          auVar22 = vpaddw_avx(auVar80,auVar22);
          auVar41 = vpsrlw_avx(auVar22,5);
          auVar22 = vpcmpgtw_avx(auVar67,auVar46);
          auVar22 = vpblendvb_avx(auVar64,auVar41,auVar22);
          *pauVar15 = auVar22;
          uVar16 = uVar16 + dx;
          pauVar15 = pauVar15 + 1;
        }
      }
      else {
        auVar33._4_4_ = iVar19;
        auVar33._0_4_ = iVar19;
        auVar33._8_4_ = iVar19;
        auVar33._12_4_ = iVar19;
        auVar33._16_4_ = iVar19;
        auVar33._20_4_ = iVar19;
        auVar33._24_4_ = iVar19;
        auVar33._28_4_ = iVar19;
        pauVar15 = (undefined1 (*) [16])local_860;
        uVar20 = 0;
        auVar67 = vpmovsxbd_avx(ZEXT416(0x3020104));
        auVar31._8_4_ = 0x10;
        auVar31._0_8_ = 0x1000000010;
        auVar31._12_4_ = 0x10;
        auVar31._16_4_ = 0x10;
        auVar31._20_4_ = 0x10;
        auVar31._24_4_ = 0x10;
        auVar31._28_4_ = 0x10;
        auVar42 = vpmovsxbd_avx(ZEXT416(0x6040208));
        auVar43._8_4_ = 0x1f;
        auVar43._0_8_ = 0x1f0000001f;
        auVar43._12_4_ = 0x1f;
        auVar43._16_4_ = 0x1f;
        auVar43._20_4_ = 0x1f;
        auVar43._24_4_ = 0x1f;
        auVar43._28_4_ = 0x1f;
        uVar16 = dx;
        for (; uVar11 != uVar20; uVar20 = uVar20 + 1) {
          iVar18 = (int)uVar16 >> (6 - bVar10 & 0x1f);
          if (iVar19 <= iVar18) {
            if (bh <= (int)uVar20) {
              uVar8 = uVar20 & 0xffffffff;
            }
            for (; uVar20 != uVar8; uVar8 = uVar8 - 1) {
              *pauVar15 = auVar64;
              pauVar15 = pauVar15 + 1;
            }
            break;
          }
          auVar56 = vpmovzxwd_avx2(*(undefined1 (*) [16])(above + iVar18));
          if (upsample_above == 0) {
            auVar38 = vpmovzxwd_avx2(*(undefined1 (*) [16])(above + (long)iVar18 + 1));
            auVar41._4_4_ = iVar18;
            auVar41._0_4_ = iVar18;
            auVar41._8_4_ = iVar18;
            auVar41._12_4_ = iVar18;
            iVar1 = iVar18 + 5;
            iVar2 = iVar18 + 6;
            iVar18 = iVar18 + 7;
            auVar22 = vpaddd_avx(auVar41,auVar67);
            auVar72 = vpermq_avx2(ZEXT1632(auVar22),0xc4);
            auVar72 = vpblendd_avx2(auVar72,ZEXT1632(auVar41),1);
            auVar73._4_4_ = iVar1;
            auVar73._0_4_ = iVar1;
            auVar73._8_4_ = iVar1;
            auVar73._12_4_ = iVar1;
            auVar73._16_4_ = iVar1;
            auVar73._20_4_ = iVar1;
            auVar73._24_4_ = iVar1;
            auVar73._28_4_ = iVar1;
            auVar72 = vpblendd_avx2(auVar72,auVar73,0x20);
            auVar74._4_4_ = iVar2;
            auVar74._0_4_ = iVar2;
            auVar74._8_4_ = iVar2;
            auVar74._12_4_ = iVar2;
            auVar74._16_4_ = iVar2;
            auVar74._20_4_ = iVar2;
            auVar74._24_4_ = iVar2;
            auVar74._28_4_ = iVar2;
            auVar72 = vpblendd_avx2(auVar72,auVar74,0x40);
            auVar75._4_4_ = iVar18;
            auVar75._0_4_ = iVar18;
            auVar75._8_4_ = iVar18;
            auVar75._12_4_ = iVar18;
            auVar75._16_4_ = iVar18;
            auVar75._20_4_ = iVar18;
            auVar75._24_4_ = iVar18;
            auVar75._28_4_ = iVar18;
            auVar73 = vpblendd_avx2(auVar72,auVar75,0x80);
            uVar17 = uVar16 >> 1;
            uVar12 = uVar17 & 0x1f;
            auVar72._0_8_ = CONCAT44(uVar17,uVar17) & 0x1f0000001f;
            auVar72._8_4_ = uVar12;
            auVar72._12_4_ = uVar12;
            auVar72._16_4_ = uVar12;
            auVar72._20_4_ = uVar12;
            auVar72._24_4_ = uVar12;
            auVar72._28_4_ = uVar12;
          }
          else {
            auVar56 = vpshufd_avx2(auVar56,0xd8);
            auVar38 = vpermq_avx2(auVar56,0xd8);
            auVar56 = vpmovzxwd_avx2(*(undefined1 (*) [16])(above + (long)iVar18 + 8));
            auVar56 = vpshufd_avx2(auVar56,0xd8);
            auVar74 = vpermq_avx2(auVar56,0xd8);
            auVar46._4_4_ = iVar18;
            auVar46._0_4_ = iVar18;
            auVar46._8_4_ = iVar18;
            auVar46._12_4_ = iVar18;
            iVar1 = iVar18 + 10;
            iVar2 = iVar18 + 0xc;
            iVar18 = iVar18 + 0xe;
            auVar22 = vpaddd_avx(auVar46,auVar42);
            auVar56 = vpermq_avx2(ZEXT1632(auVar22),0xc4);
            auVar56 = vpblendd_avx2(auVar56,ZEXT1632(auVar46),1);
            auVar69._4_4_ = iVar1;
            auVar69._0_4_ = iVar1;
            auVar69._8_4_ = iVar1;
            auVar69._12_4_ = iVar1;
            auVar69._16_4_ = iVar1;
            auVar69._20_4_ = iVar1;
            auVar69._24_4_ = iVar1;
            auVar69._28_4_ = iVar1;
            auVar56 = vpblendd_avx2(auVar56,auVar69,0x20);
            auVar70._4_4_ = iVar2;
            auVar70._0_4_ = iVar2;
            auVar70._8_4_ = iVar2;
            auVar70._12_4_ = iVar2;
            auVar70._16_4_ = iVar2;
            auVar70._20_4_ = iVar2;
            auVar70._24_4_ = iVar2;
            auVar70._28_4_ = iVar2;
            auVar56 = vpblendd_avx2(auVar56,auVar70,0x40);
            auVar71._4_4_ = iVar18;
            auVar71._0_4_ = iVar18;
            auVar71._8_4_ = iVar18;
            auVar71._12_4_ = iVar18;
            auVar71._16_4_ = iVar18;
            auVar71._20_4_ = iVar18;
            auVar71._24_4_ = iVar18;
            auVar71._28_4_ = iVar18;
            auVar73 = vpblendd_avx2(auVar56,auVar71,0x80);
            auVar55._4_4_ = uVar16;
            auVar55._0_4_ = uVar16;
            auVar55._8_4_ = uVar16;
            auVar55._12_4_ = uVar16;
            auVar55._16_4_ = uVar16;
            auVar55._20_4_ = uVar16;
            auVar55._24_4_ = uVar16;
            auVar55._28_4_ = uVar16;
            auVar72 = vpslld_avx2(auVar55,ZEXT416((uint)upsample_above));
            auVar56._0_16_ = ZEXT116(0) * auVar74._0_16_ + ZEXT116(1) * auVar38._0_16_;
            auVar56._16_16_ = ZEXT116(0) * auVar38._16_16_ + ZEXT116(1) * auVar74._0_16_;
            auVar72 = vpsrld_avx2(auVar72,1);
            auVar72 = vpand_avx2(auVar72,auVar43);
            auVar38 = vperm2i128_avx2(auVar38,auVar74,0x31);
          }
          auVar73 = vpcmpgtd_avx2(auVar33,auVar73);
          auVar38 = vpsubd_avx2(auVar38,auVar56);
          auVar72 = vpmulld_avx2(auVar38,auVar72);
          auVar56 = vpslld_avx2(auVar56,5);
          auVar56 = vpaddd_avx2(auVar56,auVar31);
          auVar56 = vpaddd_avx2(auVar72,auVar56);
          auVar56 = vpsrld_avx2(auVar56,5);
          auVar41 = vpackusdw_avx(auVar56._0_16_,auVar56._16_16_);
          auVar22 = vpackssdw_avx(auVar73._0_16_,auVar73._16_16_);
          auVar56 = vpblendvb_avx2(auVar82,ZEXT1632(auVar41),ZEXT1632(auVar22));
          *pauVar15 = auVar56._0_16_;
          uVar16 = uVar16 + dx;
          pauVar15 = pauVar15 + 1;
        }
      }
      for (lVar9 = 0; uVar11 * 0x10 != lVar9; lVar9 = lVar9 + 0x10) {
        uVar5 = *(undefined8 *)((long)local_860 + lVar9 + 8);
        *(undefined8 *)dst = *(undefined8 *)((long)local_860 + lVar9);
        *(undefined8 *)(dst + 4) = uVar5;
        dst = dst + stride;
      }
      return;
    }
    if (bw == 0x10) {
      uVar3 = above[(long)bh + 0xf];
      auVar22._2_2_ = uVar3;
      auVar22._0_2_ = uVar3;
      auVar22._4_2_ = uVar3;
      auVar22._6_2_ = uVar3;
      auVar22._8_2_ = uVar3;
      auVar22._10_2_ = uVar3;
      auVar22._12_2_ = uVar3;
      auVar22._14_2_ = uVar3;
      auVar23._16_2_ = uVar3;
      auVar23._0_16_ = auVar22;
      auVar23._18_2_ = uVar3;
      auVar23._20_2_ = uVar3;
      auVar23._22_2_ = uVar3;
      auVar23._24_2_ = uVar3;
      auVar23._26_2_ = uVar3;
      auVar23._28_2_ = uVar3;
      auVar23._30_2_ = uVar3;
      iVar19 = bh + 0xf;
      auVar26._0_2_ = (undefined2)iVar19;
      auVar26._2_2_ = auVar26._0_2_;
      auVar26._4_2_ = auVar26._0_2_;
      auVar26._6_2_ = auVar26._0_2_;
      auVar26._8_2_ = auVar26._0_2_;
      auVar26._10_2_ = auVar26._0_2_;
      auVar26._12_2_ = auVar26._0_2_;
      auVar26._14_2_ = auVar26._0_2_;
      auVar26._16_2_ = auVar26._0_2_;
      auVar26._18_2_ = auVar26._0_2_;
      auVar26._20_2_ = auVar26._0_2_;
      auVar26._22_2_ = auVar26._0_2_;
      auVar26._24_2_ = auVar26._0_2_;
      auVar26._26_2_ = auVar26._0_2_;
      auVar26._28_2_ = auVar26._0_2_;
      auVar26._30_2_ = auVar26._0_2_;
      if (bd < 0xc) {
        uVar20 = 0;
        uVar11 = 0;
        if (0 < bh) {
          uVar11 = uVar8;
        }
        pauVar14 = (undefined1 (*) [32])local_860;
        auVar28._8_2_ = 0x10;
        auVar28._0_8_ = 0x10001000100010;
        auVar28._10_2_ = 0x10;
        auVar28._12_2_ = 0x10;
        auVar28._14_2_ = 0x10;
        auVar28._16_2_ = 0x10;
        auVar28._18_2_ = 0x10;
        auVar28._20_2_ = 0x10;
        auVar28._22_2_ = 0x10;
        auVar28._24_2_ = 0x10;
        auVar28._26_2_ = 0x10;
        auVar28._28_2_ = 0x10;
        auVar28._30_2_ = 0x10;
        auVar64 = vpmovsxbw_avx(ZEXT816(0x807060504030201));
        uVar16 = dx;
        for (; uVar11 != uVar20; uVar20 = uVar20 + 1) {
          uVar17 = (int)uVar16 >> 6;
          if (iVar19 <= (int)uVar17) {
            if (bh <= (int)uVar20) {
              uVar8 = uVar20 & 0xffffffff;
            }
            for (; uVar20 != uVar8; uVar8 = uVar8 - 1) {
              *pauVar14 = auVar23;
              pauVar14 = pauVar14 + 1;
            }
            break;
          }
          uVar4 = (ushort)(uVar16 >> 1);
          uVar76 = uVar4 & 0x1f;
          auVar32._0_8_ = CONCAT26(uVar4,CONCAT24(uVar4,CONCAT22(uVar4,uVar4))) & 0x1f001f001f001f;
          auVar32._8_2_ = uVar76;
          auVar32._10_2_ = uVar76;
          auVar32._12_2_ = uVar76;
          auVar32._14_2_ = uVar76;
          auVar32._16_2_ = uVar76;
          auVar32._18_2_ = uVar76;
          auVar32._20_2_ = uVar76;
          auVar32._22_2_ = uVar76;
          auVar32._24_2_ = uVar76;
          auVar32._26_2_ = uVar76;
          auVar32._28_2_ = uVar76;
          auVar32._30_2_ = uVar76;
          auVar82 = vpsubw_avx2(*(undefined1 (*) [32])(above + (long)(int)uVar17 + 1),
                                *(undefined1 (*) [32])(above + (int)uVar17));
          auVar33 = vpmullw_avx2(auVar82,auVar32);
          auVar82 = vpsllw_avx2(*(undefined1 (*) [32])(above + (int)uVar17),5);
          auVar82 = vpaddw_avx2(auVar82,auVar28);
          auVar82 = vpaddw_avx2(auVar33,auVar82);
          auVar33 = vpsrlw_avx2(auVar82,5);
          auVar37._0_2_ = (undefined2)uVar17;
          auVar37._2_2_ = auVar37._0_2_;
          auVar37._4_2_ = auVar37._0_2_;
          auVar37._6_2_ = auVar37._0_2_;
          auVar37._8_2_ = auVar37._0_2_;
          auVar37._10_2_ = auVar37._0_2_;
          auVar37._12_2_ = auVar37._0_2_;
          auVar37._14_2_ = auVar37._0_2_;
          auVar67 = vpaddw_avx(auVar37,auVar64);
          auVar42 = vpslldq_avx(auVar67,2);
          auVar42 = vpblendw_avx(auVar42,ZEXT416(uVar17),1);
          auVar67 = vpsrldq_avx(auVar67,0xe);
          auVar39._0_16_ = ZEXT116(0) * auVar67 + ZEXT116(1) * auVar22;
          auVar39._16_16_ = ZEXT116(0) * auVar23._16_16_ + ZEXT116(1) * auVar67;
          auVar48._0_2_ = (undefined2)(uVar17 + 9);
          auVar48._2_2_ = auVar48._0_2_;
          auVar48._4_2_ = auVar48._0_2_;
          auVar48._6_2_ = auVar48._0_2_;
          auVar48._8_2_ = auVar48._0_2_;
          auVar48._10_2_ = auVar48._0_2_;
          auVar48._12_2_ = auVar48._0_2_;
          auVar48._14_2_ = auVar48._0_2_;
          auVar48._16_2_ = auVar48._0_2_;
          auVar48._18_2_ = auVar48._0_2_;
          auVar48._20_2_ = auVar48._0_2_;
          auVar48._22_2_ = auVar48._0_2_;
          auVar48._24_2_ = auVar48._0_2_;
          auVar48._26_2_ = auVar48._0_2_;
          auVar48._28_2_ = auVar48._0_2_;
          auVar48._30_2_ = auVar48._0_2_;
          auVar82 = vpblendw_avx2(auVar39,auVar48,2);
          auVar49._0_2_ = (undefined2)(uVar17 + 10);
          auVar49._2_2_ = auVar49._0_2_;
          auVar49._4_2_ = auVar49._0_2_;
          auVar49._6_2_ = auVar49._0_2_;
          auVar49._8_2_ = auVar49._0_2_;
          auVar49._10_2_ = auVar49._0_2_;
          auVar49._12_2_ = auVar49._0_2_;
          auVar49._14_2_ = auVar49._0_2_;
          auVar49._16_2_ = auVar49._0_2_;
          auVar49._18_2_ = auVar49._0_2_;
          auVar49._20_2_ = auVar49._0_2_;
          auVar49._22_2_ = auVar49._0_2_;
          auVar49._24_2_ = auVar49._0_2_;
          auVar49._26_2_ = auVar49._0_2_;
          auVar49._28_2_ = auVar49._0_2_;
          auVar49._30_2_ = auVar49._0_2_;
          auVar82 = vpblendw_avx2(auVar82,auVar49,4);
          auVar50._0_2_ = (undefined2)(uVar17 + 0xb);
          auVar50._2_2_ = auVar50._0_2_;
          auVar50._4_2_ = auVar50._0_2_;
          auVar50._6_2_ = auVar50._0_2_;
          auVar50._8_2_ = auVar50._0_2_;
          auVar50._10_2_ = auVar50._0_2_;
          auVar50._12_2_ = auVar50._0_2_;
          auVar50._14_2_ = auVar50._0_2_;
          auVar50._16_2_ = auVar50._0_2_;
          auVar50._18_2_ = auVar50._0_2_;
          auVar50._20_2_ = auVar50._0_2_;
          auVar50._22_2_ = auVar50._0_2_;
          auVar50._24_2_ = auVar50._0_2_;
          auVar50._26_2_ = auVar50._0_2_;
          auVar50._28_2_ = auVar50._0_2_;
          auVar50._30_2_ = auVar50._0_2_;
          auVar82 = vpblendw_avx2(auVar82,auVar50,8);
          auVar51._0_2_ = (undefined2)(uVar17 + 0xc);
          auVar51._2_2_ = auVar51._0_2_;
          auVar51._4_2_ = auVar51._0_2_;
          auVar51._6_2_ = auVar51._0_2_;
          auVar51._8_2_ = auVar51._0_2_;
          auVar51._10_2_ = auVar51._0_2_;
          auVar51._12_2_ = auVar51._0_2_;
          auVar51._14_2_ = auVar51._0_2_;
          auVar51._16_2_ = auVar51._0_2_;
          auVar51._18_2_ = auVar51._0_2_;
          auVar51._20_2_ = auVar51._0_2_;
          auVar51._22_2_ = auVar51._0_2_;
          auVar51._24_2_ = auVar51._0_2_;
          auVar51._26_2_ = auVar51._0_2_;
          auVar51._28_2_ = auVar51._0_2_;
          auVar51._30_2_ = auVar51._0_2_;
          auVar82 = vpblendw_avx2(auVar82,auVar51,0x10);
          auVar52._0_2_ = (undefined2)(uVar17 + 0xd);
          auVar52._2_2_ = auVar52._0_2_;
          auVar52._4_2_ = auVar52._0_2_;
          auVar52._6_2_ = auVar52._0_2_;
          auVar52._8_2_ = auVar52._0_2_;
          auVar52._10_2_ = auVar52._0_2_;
          auVar52._12_2_ = auVar52._0_2_;
          auVar52._14_2_ = auVar52._0_2_;
          auVar52._16_2_ = auVar52._0_2_;
          auVar52._18_2_ = auVar52._0_2_;
          auVar52._20_2_ = auVar52._0_2_;
          auVar52._22_2_ = auVar52._0_2_;
          auVar52._24_2_ = auVar52._0_2_;
          auVar52._26_2_ = auVar52._0_2_;
          auVar52._28_2_ = auVar52._0_2_;
          auVar52._30_2_ = auVar52._0_2_;
          auVar82 = vpblendw_avx2(auVar82,auVar52,0x20);
          auVar53._0_2_ = (undefined2)(uVar17 + 0xe);
          auVar53._2_2_ = auVar53._0_2_;
          auVar53._4_2_ = auVar53._0_2_;
          auVar53._6_2_ = auVar53._0_2_;
          auVar53._8_2_ = auVar53._0_2_;
          auVar53._10_2_ = auVar53._0_2_;
          auVar53._12_2_ = auVar53._0_2_;
          auVar53._14_2_ = auVar53._0_2_;
          auVar53._16_2_ = auVar53._0_2_;
          auVar53._18_2_ = auVar53._0_2_;
          auVar53._20_2_ = auVar53._0_2_;
          auVar53._22_2_ = auVar53._0_2_;
          auVar53._24_2_ = auVar53._0_2_;
          auVar53._26_2_ = auVar53._0_2_;
          auVar53._28_2_ = auVar53._0_2_;
          auVar53._30_2_ = auVar53._0_2_;
          auVar82 = vpblendw_avx2(auVar82,auVar53,0x40);
          auVar54._0_2_ = (undefined2)(uVar17 + 0xf);
          auVar54._2_2_ = auVar54._0_2_;
          auVar54._4_2_ = auVar54._0_2_;
          auVar54._6_2_ = auVar54._0_2_;
          auVar54._8_2_ = auVar54._0_2_;
          auVar54._10_2_ = auVar54._0_2_;
          auVar54._12_2_ = auVar54._0_2_;
          auVar54._14_2_ = auVar54._0_2_;
          auVar54._16_2_ = auVar54._0_2_;
          auVar54._18_2_ = auVar54._0_2_;
          auVar54._20_2_ = auVar54._0_2_;
          auVar54._22_2_ = auVar54._0_2_;
          auVar54._24_2_ = auVar54._0_2_;
          auVar54._26_2_ = auVar54._0_2_;
          auVar54._28_2_ = auVar54._0_2_;
          auVar54._30_2_ = auVar54._0_2_;
          auVar82 = vpblendw_avx2(auVar82,auVar54,0x80);
          auVar82 = vpblendd_avx2(ZEXT1632(auVar42),auVar82,0xf0);
          auVar82 = vpcmpgtw_avx2(auVar26,auVar82);
          auVar82 = vpblendvb_avx2(auVar23,auVar33,auVar82);
          *pauVar14 = auVar82;
          uVar16 = uVar16 + dx;
          pauVar14 = pauVar14 + 1;
        }
      }
      else {
        uVar20 = 0;
        uVar11 = 0;
        if (0 < bh) {
          uVar11 = uVar8;
        }
        pauVar14 = (undefined1 (*) [32])local_860;
        auVar29._8_4_ = 0x10;
        auVar29._0_8_ = 0x1000000010;
        auVar29._12_4_ = 0x10;
        auVar29._16_4_ = 0x10;
        auVar29._20_4_ = 0x10;
        auVar29._24_4_ = 0x10;
        auVar29._28_4_ = 0x10;
        auVar64 = vpmovsxbw_avx(ZEXT816(0x807060504030201));
        uVar16 = dx;
        for (; uVar11 != uVar20; uVar20 = uVar20 + 1) {
          uVar17 = (int)uVar16 >> 6;
          if (iVar19 <= (int)uVar17) {
            if (bh <= (int)uVar20) {
              uVar8 = uVar20 & 0xffffffff;
            }
            for (; uVar20 != uVar8; uVar8 = uVar8 - 1) {
              *pauVar14 = auVar23;
              pauVar14 = pauVar14 + 1;
            }
            break;
          }
          uVar12 = uVar16 >> 1;
          uVar13 = uVar12 & 0x1f;
          auVar34._0_8_ = CONCAT44(uVar12,uVar12) & 0x1f0000001f;
          auVar34._8_4_ = uVar13;
          auVar34._12_4_ = uVar13;
          auVar34._16_4_ = uVar13;
          auVar34._20_4_ = uVar13;
          auVar34._24_4_ = uVar13;
          auVar34._28_4_ = uVar13;
          auVar67 = auVar22;
          if ((int)uVar17 < bh + 7) {
            auVar82 = vpmovzxwd_avx2(*(undefined1 (*) [16])(above + (long)(int)uVar17 + 8));
            auVar33 = vpmovzxwd_avx2(*(undefined1 (*) [16])(above + (long)(int)uVar17 + 9));
            auVar33 = vpsubd_avx2(auVar33,auVar82);
            auVar82 = vpslld_avx2(auVar82,5);
            auVar33 = vpmulld_avx2(auVar33,auVar34);
            auVar82 = vpaddd_avx2(auVar82,auVar29);
            auVar82 = vpaddd_avx2(auVar33,auVar82);
            auVar82 = vpsrld_avx2(auVar82,5);
            auVar44._0_16_ = ZEXT116(0) * auVar22 + ZEXT116(1) * auVar82._16_16_;
            auVar44._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar22;
            auVar82 = vpackusdw_avx2(auVar82,auVar44);
            auVar67 = auVar82._0_16_;
          }
          auVar82 = vpmovzxwd_avx2(*(undefined1 (*) [16])(above + (int)uVar17));
          auVar33 = vpmovzxwd_avx2(*(undefined1 (*) [16])(above + (long)(int)uVar17 + 1));
          auVar33 = vpsubd_avx2(auVar33,auVar82);
          auVar82 = vpslld_avx2(auVar82,5);
          auVar33 = vpmulld_avx2(auVar33,auVar34);
          auVar82 = vpaddd_avx2(auVar82,auVar29);
          auVar82 = vpaddd_avx2(auVar33,auVar82);
          auVar82 = vpsrld_avx2(auVar82,5);
          auVar82 = vpackusdw_avx2(auVar82,ZEXT1632(auVar82._16_16_));
          auVar35._0_16_ = ZEXT116(0) * auVar67 + ZEXT116(1) * auVar82._0_16_;
          auVar35._16_16_ = ZEXT116(0) * auVar82._16_16_ + ZEXT116(1) * auVar67;
          auVar80._0_2_ = (undefined2)uVar17;
          auVar80._2_2_ = auVar80._0_2_;
          auVar80._4_2_ = auVar80._0_2_;
          auVar80._6_2_ = auVar80._0_2_;
          auVar80._8_2_ = auVar80._0_2_;
          auVar80._10_2_ = auVar80._0_2_;
          auVar80._12_2_ = auVar80._0_2_;
          auVar80._14_2_ = auVar80._0_2_;
          auVar67 = vpaddw_avx(auVar80,auVar64);
          auVar42 = vpslldq_avx(auVar67,2);
          auVar42 = vpblendw_avx(auVar42,ZEXT416(uVar17),1);
          auVar67 = vpsrldq_avx(auVar67,0xe);
          auVar40._0_16_ = ZEXT116(0) * auVar67 + ZEXT116(1) * auVar22;
          auVar40._16_16_ = ZEXT116(0) * auVar23._16_16_ + ZEXT116(1) * auVar67;
          auVar57._0_2_ = (undefined2)(uVar17 + 9);
          auVar57._2_2_ = auVar57._0_2_;
          auVar57._4_2_ = auVar57._0_2_;
          auVar57._6_2_ = auVar57._0_2_;
          auVar57._8_2_ = auVar57._0_2_;
          auVar57._10_2_ = auVar57._0_2_;
          auVar57._12_2_ = auVar57._0_2_;
          auVar57._14_2_ = auVar57._0_2_;
          auVar57._16_2_ = auVar57._0_2_;
          auVar57._18_2_ = auVar57._0_2_;
          auVar57._20_2_ = auVar57._0_2_;
          auVar57._22_2_ = auVar57._0_2_;
          auVar57._24_2_ = auVar57._0_2_;
          auVar57._26_2_ = auVar57._0_2_;
          auVar57._28_2_ = auVar57._0_2_;
          auVar57._30_2_ = auVar57._0_2_;
          auVar82 = vpblendw_avx2(auVar40,auVar57,2);
          auVar58._0_2_ = (undefined2)(uVar17 + 10);
          auVar58._2_2_ = auVar58._0_2_;
          auVar58._4_2_ = auVar58._0_2_;
          auVar58._6_2_ = auVar58._0_2_;
          auVar58._8_2_ = auVar58._0_2_;
          auVar58._10_2_ = auVar58._0_2_;
          auVar58._12_2_ = auVar58._0_2_;
          auVar58._14_2_ = auVar58._0_2_;
          auVar58._16_2_ = auVar58._0_2_;
          auVar58._18_2_ = auVar58._0_2_;
          auVar58._20_2_ = auVar58._0_2_;
          auVar58._22_2_ = auVar58._0_2_;
          auVar58._24_2_ = auVar58._0_2_;
          auVar58._26_2_ = auVar58._0_2_;
          auVar58._28_2_ = auVar58._0_2_;
          auVar58._30_2_ = auVar58._0_2_;
          auVar82 = vpblendw_avx2(auVar82,auVar58,4);
          auVar59._0_2_ = (undefined2)(uVar17 + 0xb);
          auVar59._2_2_ = auVar59._0_2_;
          auVar59._4_2_ = auVar59._0_2_;
          auVar59._6_2_ = auVar59._0_2_;
          auVar59._8_2_ = auVar59._0_2_;
          auVar59._10_2_ = auVar59._0_2_;
          auVar59._12_2_ = auVar59._0_2_;
          auVar59._14_2_ = auVar59._0_2_;
          auVar59._16_2_ = auVar59._0_2_;
          auVar59._18_2_ = auVar59._0_2_;
          auVar59._20_2_ = auVar59._0_2_;
          auVar59._22_2_ = auVar59._0_2_;
          auVar59._24_2_ = auVar59._0_2_;
          auVar59._26_2_ = auVar59._0_2_;
          auVar59._28_2_ = auVar59._0_2_;
          auVar59._30_2_ = auVar59._0_2_;
          auVar82 = vpblendw_avx2(auVar82,auVar59,8);
          auVar60._0_2_ = (undefined2)(uVar17 + 0xc);
          auVar60._2_2_ = auVar60._0_2_;
          auVar60._4_2_ = auVar60._0_2_;
          auVar60._6_2_ = auVar60._0_2_;
          auVar60._8_2_ = auVar60._0_2_;
          auVar60._10_2_ = auVar60._0_2_;
          auVar60._12_2_ = auVar60._0_2_;
          auVar60._14_2_ = auVar60._0_2_;
          auVar60._16_2_ = auVar60._0_2_;
          auVar60._18_2_ = auVar60._0_2_;
          auVar60._20_2_ = auVar60._0_2_;
          auVar60._22_2_ = auVar60._0_2_;
          auVar60._24_2_ = auVar60._0_2_;
          auVar60._26_2_ = auVar60._0_2_;
          auVar60._28_2_ = auVar60._0_2_;
          auVar60._30_2_ = auVar60._0_2_;
          auVar82 = vpblendw_avx2(auVar82,auVar60,0x10);
          auVar61._0_2_ = (undefined2)(uVar17 + 0xd);
          auVar61._2_2_ = auVar61._0_2_;
          auVar61._4_2_ = auVar61._0_2_;
          auVar61._6_2_ = auVar61._0_2_;
          auVar61._8_2_ = auVar61._0_2_;
          auVar61._10_2_ = auVar61._0_2_;
          auVar61._12_2_ = auVar61._0_2_;
          auVar61._14_2_ = auVar61._0_2_;
          auVar61._16_2_ = auVar61._0_2_;
          auVar61._18_2_ = auVar61._0_2_;
          auVar61._20_2_ = auVar61._0_2_;
          auVar61._22_2_ = auVar61._0_2_;
          auVar61._24_2_ = auVar61._0_2_;
          auVar61._26_2_ = auVar61._0_2_;
          auVar61._28_2_ = auVar61._0_2_;
          auVar61._30_2_ = auVar61._0_2_;
          auVar82 = vpblendw_avx2(auVar82,auVar61,0x20);
          auVar62._0_2_ = (undefined2)(uVar17 + 0xe);
          auVar62._2_2_ = auVar62._0_2_;
          auVar62._4_2_ = auVar62._0_2_;
          auVar62._6_2_ = auVar62._0_2_;
          auVar62._8_2_ = auVar62._0_2_;
          auVar62._10_2_ = auVar62._0_2_;
          auVar62._12_2_ = auVar62._0_2_;
          auVar62._14_2_ = auVar62._0_2_;
          auVar62._16_2_ = auVar62._0_2_;
          auVar62._18_2_ = auVar62._0_2_;
          auVar62._20_2_ = auVar62._0_2_;
          auVar62._22_2_ = auVar62._0_2_;
          auVar62._24_2_ = auVar62._0_2_;
          auVar62._26_2_ = auVar62._0_2_;
          auVar62._28_2_ = auVar62._0_2_;
          auVar62._30_2_ = auVar62._0_2_;
          auVar82 = vpblendw_avx2(auVar82,auVar62,0x40);
          auVar63._0_2_ = (undefined2)(uVar17 + 0xf);
          auVar63._2_2_ = auVar63._0_2_;
          auVar63._4_2_ = auVar63._0_2_;
          auVar63._6_2_ = auVar63._0_2_;
          auVar63._8_2_ = auVar63._0_2_;
          auVar63._10_2_ = auVar63._0_2_;
          auVar63._12_2_ = auVar63._0_2_;
          auVar63._14_2_ = auVar63._0_2_;
          auVar63._16_2_ = auVar63._0_2_;
          auVar63._18_2_ = auVar63._0_2_;
          auVar63._20_2_ = auVar63._0_2_;
          auVar63._22_2_ = auVar63._0_2_;
          auVar63._24_2_ = auVar63._0_2_;
          auVar63._26_2_ = auVar63._0_2_;
          auVar63._28_2_ = auVar63._0_2_;
          auVar63._30_2_ = auVar63._0_2_;
          auVar82 = vpblendw_avx2(auVar82,auVar63,0x80);
          auVar82 = vpblendd_avx2(ZEXT1632(auVar42),auVar82,0xf0);
          auVar82 = vpcmpgtw_avx2(auVar26,auVar82);
          auVar82 = vpblendvb_avx2(auVar23,auVar35,auVar82);
          *pauVar14 = auVar82;
          uVar16 = uVar16 + dx;
          pauVar14 = pauVar14 + 1;
        }
      }
      for (lVar9 = 0; uVar11 * 0x20 != lVar9; lVar9 = lVar9 + 0x20) {
        uVar5 = *(undefined8 *)((long)local_860 + lVar9 + 8);
        uVar6 = *(undefined8 *)((long)local_860 + lVar9 + 0x10);
        uVar7 = *(undefined8 *)((long)local_860 + lVar9 + 0x18);
        *(undefined8 *)dst = *(undefined8 *)((long)local_860 + lVar9);
        *(undefined8 *)(dst + 4) = uVar5;
        *(undefined8 *)(dst + 8) = uVar6;
        *(undefined8 *)(dst + 0xc) = uVar7;
        dst = dst + stride;
      }
      return;
    }
    if (bw == 0x20) {
      highbd_dr_prediction_z1_32xN_avx2(bh,dst,stride,above,dx,bd,in_stack_fffffffffffff780);
    }
    else if (bw == 4) {
      iVar19 = bh + 3 << (bVar10 & 0x1f);
      uVar3 = above[iVar19];
      auVar21._2_2_ = uVar3;
      auVar21._0_2_ = uVar3;
      auVar21._4_2_ = uVar3;
      auVar21._6_2_ = uVar3;
      auVar21._8_2_ = uVar3;
      auVar21._10_2_ = uVar3;
      auVar21._12_2_ = uVar3;
      auVar21._14_2_ = uVar3;
      uVar11 = 0;
      if (0 < bh) {
        uVar11 = (ulong)(uint)bh;
      }
      if (0xb < bd) {
        auVar25._4_4_ = iVar19;
        auVar25._0_4_ = iVar19;
        auVar25._8_4_ = iVar19;
        auVar25._12_4_ = iVar19;
        pauVar15 = (undefined1 (*) [16])local_860;
        uVar20 = 0;
        auVar27._8_4_ = 0x10;
        auVar27._0_8_ = 0x1000000010;
        auVar27._12_4_ = 0x10;
        auVar36._8_4_ = 0x1f;
        auVar36._0_8_ = 0x1f0000001f;
        auVar36._12_4_ = 0x1f;
        auVar36._16_4_ = 0x1f;
        auVar36._20_4_ = 0x1f;
        auVar36._24_4_ = 0x1f;
        auVar36._28_4_ = 0x1f;
        uVar16 = dx;
LAB_002f5f84:
        if (uVar11 != uVar20) {
          uVar17 = (int)uVar16 >> (6 - bVar10 & 0x1f);
          if ((int)uVar17 < iVar19) goto code_r0x002f5f9f;
          if (bh <= (int)uVar20) {
            uVar8 = uVar20 & 0xffffffff;
          }
          for (; uVar20 != uVar8; uVar8 = uVar8 - 1) {
            *pauVar15 = auVar21;
            pauVar15 = pauVar15 + 1;
          }
        }
        goto LAB_002f6168;
      }
      auVar24._0_2_ = (undefined2)iVar19;
      auVar24._2_2_ = auVar24._0_2_;
      auVar24._4_2_ = auVar24._0_2_;
      auVar24._6_2_ = auVar24._0_2_;
      auVar24._8_2_ = auVar24._0_2_;
      auVar24._10_2_ = auVar24._0_2_;
      auVar24._12_2_ = auVar24._0_2_;
      auVar24._14_2_ = auVar24._0_2_;
      pauVar15 = (undefined1 (*) [16])local_860;
      uVar20 = 0;
      auVar30._8_2_ = 0x10;
      auVar30._0_8_ = 0x10001000100010;
      auVar30._10_2_ = 0x10;
      auVar30._12_2_ = 0x10;
      auVar30._14_2_ = 0x10;
      auVar47._8_2_ = 0x1f;
      auVar47._0_8_ = 0x1f001f001f001f;
      auVar47._10_2_ = 0x1f;
      auVar47._12_2_ = 0x1f;
      auVar47._14_2_ = 0x1f;
      auVar47._16_2_ = 0x1f;
      auVar47._18_2_ = 0x1f;
      auVar47._20_2_ = 0x1f;
      auVar47._22_2_ = 0x1f;
      auVar47._24_2_ = 0x1f;
      auVar47._26_2_ = 0x1f;
      auVar47._28_2_ = 0x1f;
      auVar47._30_2_ = 0x1f;
      uVar16 = dx;
      while( true ) {
        if (uVar11 == uVar20) goto LAB_002f6168;
        uVar17 = (int)uVar16 >> (6 - bVar10 & 0x1f);
        if (iVar19 <= (int)uVar17) break;
        auVar64 = *(undefined1 (*) [16])(above + (int)uVar17);
        auVar77._0_2_ = (undefined2)uVar17;
        if (upsample_above == 0) {
          auVar67 = *(undefined1 (*) [16])(above + (long)(int)uVar17 + 1);
          auVar78._2_2_ = auVar77._0_2_;
          auVar78._0_2_ = auVar77._0_2_;
          auVar78._4_2_ = auVar77._0_2_;
          auVar78._6_2_ = auVar77._0_2_;
          auVar78._8_2_ = auVar77._0_2_;
          auVar78._10_2_ = auVar77._0_2_;
          auVar78._12_2_ = auVar77._0_2_;
          auVar78._14_2_ = auVar77._0_2_;
          auVar42 = vpaddw_avx(auVar78,ZEXT816(0x7000600050004));
          auVar22 = vpinsrw_avx(ZEXT416(uVar17),uVar17 + 1,1);
          auVar22 = vpinsrw_avx(auVar22,uVar17 + 2,2);
          auVar22 = vpinsrw_avx(auVar22,uVar17 + 3,3);
          auVar42 = vpunpcklqdq_avx(auVar22,auVar42);
          uVar4 = (ushort)(uVar16 >> 1);
          uVar76 = uVar4 & 0x1f;
          auVar79._0_8_ = CONCAT26(uVar4,CONCAT24(uVar4,CONCAT22(uVar4,uVar4))) & 0x1f001f001f001f;
          auVar79._8_2_ = uVar76;
          auVar79._10_2_ = uVar76;
          auVar79._12_2_ = uVar76;
          auVar79._14_2_ = uVar76;
        }
        else {
          auVar64 = vpshufb_avx(auVar64,_DAT_00470600);
          auVar67 = vpsrldq_avx(auVar64,8);
          auVar77._2_2_ = auVar77._0_2_;
          auVar77._4_2_ = auVar77._0_2_;
          auVar77._6_2_ = auVar77._0_2_;
          auVar77._8_2_ = auVar77._0_2_;
          auVar77._10_2_ = auVar77._0_2_;
          auVar77._12_2_ = auVar77._0_2_;
          auVar77._14_2_ = auVar77._0_2_;
          auVar42 = vpinsrw_avx(ZEXT416(uVar17),uVar17 + 2,1);
          auVar42 = vpinsrw_avx(auVar42,uVar17 + 4,2);
          auVar22 = vpinsrw_avx(auVar42,uVar17 + 6,3);
          auVar42 = vpaddw_avx(auVar77,ZEXT816(0xe000c000a0008));
          auVar42 = vpunpcklqdq_avx(auVar22,auVar42);
          auVar81._0_2_ = (undefined2)uVar16;
          auVar81._2_2_ = auVar81._0_2_;
          auVar81._4_2_ = auVar81._0_2_;
          auVar81._6_2_ = auVar81._0_2_;
          auVar81._8_2_ = auVar81._0_2_;
          auVar81._10_2_ = auVar81._0_2_;
          auVar81._12_2_ = auVar81._0_2_;
          auVar81._14_2_ = auVar81._0_2_;
          auVar81._16_2_ = auVar81._0_2_;
          auVar81._18_2_ = auVar81._0_2_;
          auVar81._20_2_ = auVar81._0_2_;
          auVar81._22_2_ = auVar81._0_2_;
          auVar81._24_2_ = auVar81._0_2_;
          auVar81._26_2_ = auVar81._0_2_;
          auVar81._28_2_ = auVar81._0_2_;
          auVar81._30_2_ = auVar81._0_2_;
          auVar82 = vpsllw_avx2(auVar81,ZEXT416((uint)upsample_above));
          auVar82 = vpsrlw_avx2(auVar82,1);
          auVar82 = vpand_avx2(auVar82,auVar47);
          auVar79 = auVar82._0_16_;
        }
        auVar42 = vpcmpgtw_avx(auVar24,auVar42);
        auVar67 = vpsubw_avx(auVar67,auVar64);
        auVar67 = vpmullw_avx(auVar67,auVar79);
        auVar64 = vpsllw_avx(auVar64,5);
        auVar64 = vpaddw_avx(auVar64,auVar30);
        auVar64 = vpaddw_avx(auVar67,auVar64);
        auVar64 = vpsrlw_avx(auVar64,5);
        auVar64 = vpblendvb_avx(auVar21,auVar64,auVar42);
        *pauVar15 = auVar64;
        uVar16 = uVar16 + dx;
        uVar20 = uVar20 + 1;
        pauVar15 = pauVar15 + 1;
      }
      if (bh <= (int)uVar20) {
        uVar8 = uVar20 & 0xffffffff;
      }
      for (; uVar20 != uVar8; uVar8 = uVar8 - 1) {
        *pauVar15 = auVar21;
        pauVar15 = pauVar15 + 1;
      }
LAB_002f6168:
      for (lVar9 = 0; uVar11 * 0x10 != lVar9; lVar9 = lVar9 + 0x10) {
        *(undefined8 *)dst = *(undefined8 *)((long)local_860 + lVar9);
        dst = dst + stride;
      }
    }
  }
  return;
code_r0x002f5f9f:
  auVar82 = vpmovzxwd_avx2(*(undefined1 (*) [16])(above + (int)uVar17));
  auVar64 = auVar82._0_16_;
  if (upsample_above == 0) {
    auVar82 = vpmovzxwd_avx2(*(undefined1 (*) [16])(above + (long)(int)uVar17 + 1));
    auVar42 = auVar82._0_16_;
    auVar67 = vpinsrd_avx(ZEXT416(uVar17),uVar17 + 1,1);
    auVar67 = vpinsrd_avx(auVar67,uVar17 + 2,2);
    auVar67 = vpinsrd_avx(auVar67,uVar17 + 3,3);
    uVar17 = uVar16 >> 1;
    auVar65._0_8_ = CONCAT44(uVar17,uVar17) & 0x1f0000001f;
    auVar65._8_4_ = uVar17 & 0x1f;
    auVar65._12_4_ = uVar17 & 0x1f;
  }
  else {
    auVar82 = vpshufd_avx2(auVar82,0xd8);
    auVar82 = vpermq_avx2(auVar82,0xd8);
    auVar64 = auVar82._0_16_;
    auVar42 = ZEXT116(0) * auVar21 + ZEXT116(1) * auVar82._16_16_;
    auVar67 = vpinsrd_avx(ZEXT416(uVar17),uVar17 + 2,1);
    auVar67 = vpinsrd_avx(auVar67,uVar17 + 4,2);
    auVar67 = vpinsrd_avx(auVar67,uVar17 + 6,3);
    auVar66._4_4_ = uVar16;
    auVar66._0_4_ = uVar16;
    auVar66._8_4_ = uVar16;
    auVar66._12_4_ = uVar16;
    auVar66._16_4_ = uVar16;
    auVar66._20_4_ = uVar16;
    auVar66._24_4_ = uVar16;
    auVar66._28_4_ = uVar16;
    auVar82 = vpslld_avx2(auVar66,ZEXT416((uint)upsample_above));
    auVar82 = vpsrld_avx2(auVar82,1);
    auVar82 = vpand_avx2(auVar82,auVar36);
    auVar65 = auVar82._0_16_;
  }
  auVar22 = vpcmpgtd_avx(auVar25,auVar67);
  auVar67 = vpsubd_avx(auVar42,auVar64);
  auVar67 = vpmulld_avx(auVar67,auVar65);
  auVar64 = vpslld_avx(auVar64,5);
  auVar64 = vpaddd_avx(auVar64,auVar27);
  auVar64 = vpaddd_avx(auVar67,auVar64);
  auVar64 = vpsrld_avx(auVar64,5);
  auVar67 = vpackusdw_avx(auVar64,auVar64);
  auVar64 = vpackssdw_avx(auVar22,auVar22);
  auVar64 = vpblendvb_avx(auVar21,auVar67,auVar64);
  *pauVar15 = auVar64;
  uVar16 = uVar16 + dx;
  uVar20 = uVar20 + 1;
  pauVar15 = pauVar15 + 1;
  goto LAB_002f5f84;
}

Assistant:

void av1_highbd_dr_prediction_z1_avx2(uint16_t *dst, ptrdiff_t stride, int bw,
                                      int bh, const uint16_t *above,
                                      const uint16_t *left, int upsample_above,
                                      int dx, int dy, int bd) {
  (void)left;
  (void)dy;

  switch (bw) {
    case 4:
      highbd_dr_prediction_z1_4xN_avx2(bh, dst, stride, above, upsample_above,
                                       dx, bd);
      break;
    case 8:
      highbd_dr_prediction_z1_8xN_avx2(bh, dst, stride, above, upsample_above,
                                       dx, bd);
      break;
    case 16:
      highbd_dr_prediction_z1_16xN_avx2(bh, dst, stride, above, upsample_above,
                                        dx, bd);
      break;
    case 32:
      highbd_dr_prediction_z1_32xN_avx2(bh, dst, stride, above, upsample_above,
                                        dx, bd);
      break;
    case 64:
      if (bd < 12) {
        highbd_dr_prediction_z1_64xN_avx2(bh, dst, stride, above,
                                          upsample_above, dx);
      } else {
        highbd_dr_prediction_32bit_z1_64xN_avx2(bh, dst, stride, above,
                                                upsample_above, dx);
      }
      break;
    default: break;
  }
  return;
}